

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Hour(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cppnet::Timer> sVar3;
  shared_ptr<cppnet::TimerContainer> timer;
  shared_ptr<cppnet::TimerContainer> min_sub;
  shared_ptr<cppnet::TimerContainer> sec_sub;
  TIME_UNIT local_8c;
  __shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2> local_88;
  shared_ptr<cppnet::TimerContainer> local_78;
  undefined4 local_64;
  void *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88._M_ptr._0_4_ = 1;
  local_8c = TU_SECOND;
  std::make_shared<cppnet::TimerContainer,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_60,(TIME_UNIT *)&local_78,(TIME_UNIT *)&local_88);
  local_88._M_ptr = (element_type *)CONCAT44(local_88._M_ptr._4_4_,1000);
  local_8c = TU_MINUTE;
  std::
  make_shared<cppnet::TimerContainer,std::shared_ptr<cppnet::TimerContainer>&,cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_78,(TIME_UNIT *)&local_60,(TIME_UNIT *)&local_88);
  local_8c = TU_MINUTE;
  local_64 = 3600000;
  std::
  make_shared<cppnet::TimerContainer,std::shared_ptr<cppnet::TimerContainer>&,cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            ((shared_ptr<cppnet::TimerContainer> *)&local_88,(TIME_UNIT *)&local_78,&local_8c);
  std::__shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&local_88);
  std::__weak_ptr<cppnet::TimerContainer,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::TimerContainer,(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_60 + 0x38),&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  peVar2 = local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&local_88);
  std::__weak_ptr<cppnet::TimerContainer,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::TimerContainer,(__gnu_cxx::_Lock_policy)2> *)&peVar2->_root_timer,
             &local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  _Var1._M_pi = local_88._M_refcount._M_pi;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_Timer = (_func_int **)local_88._M_ptr;
  in_RDI[1]._vptr_Timer = (_func_int **)_Var1._M_pi;
  local_88._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  sVar3.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::Timer>)
         sVar3.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Hour() {
    auto sec_sub = std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
    auto min_sub = std::make_shared<TimerContainer>(sec_sub, TU_SECOND, TU_MINUTE);
    auto timer = std::make_shared<TimerContainer>(min_sub, TU_MINUTE, TU_HOUR);
    sec_sub->SetRootTimer(timer);
    min_sub->SetRootTimer(timer);

    return timer;
}